

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_opt2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 ZSTD_dictMode_e dictMode)

{
  BYTE *pBVar1;
  byte bVar2;
  ZSTD_optimal_t *pZVar3;
  rawSeqStore_t *prVar4;
  BYTE *pBVar5;
  seqDef *psVar6;
  uint uVar7;
  undefined8 uVar8;
  ZSTD_optimal_t *pZVar9;
  optState_t *optPtr;
  ZSTD_match_t *pZVar10;
  U32 UVar11;
  uint uVar12;
  U32 UVar13;
  U32 UVar14;
  U32 UVar15;
  U32 UVar16;
  U32 UVar17;
  long lVar18;
  ZSTD_optimal_t *pZVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  ZSTD_matchState_t *pZVar27;
  U32 UVar28;
  BYTE *pBVar29;
  uint uVar30;
  int iVar31;
  ulong uVar32;
  bool bVar33;
  repcodes_t rVar34;
  BYTE *local_150;
  ulong local_148;
  U32 nbMatches;
  ulong local_128;
  BYTE *local_120;
  optState_t *local_118;
  ZSTD_match_t *local_110;
  BYTE *local_108;
  ZSTD_matchState_t *local_100;
  BYTE *local_f8;
  BYTE *local_f0;
  int local_e4;
  uint local_e0;
  U32 nextToUpdate3;
  U32 (*local_d8) [3];
  void *local_d0;
  U32 *local_c8;
  undefined8 local_c0;
  U32 local_b8;
  ulong local_b0;
  code *local_a8;
  BYTE *local_a0;
  ulong local_98;
  ZSTD_optimal_t *local_90;
  seqStore_t *local_88;
  BYTE *local_80;
  ulong local_78;
  ulong local_70;
  ZSTD_optLdm_t local_68;
  
  uVar24 = (ms->cParams).minMatch;
  uVar12 = 3;
  if (uVar24 < 6) {
    uVar12 = uVar24 - 3;
  }
  uVar20 = 0;
  if (2 < uVar24) {
    uVar20 = (ulong)uVar12;
  }
  uVar12 = (ms->window).dictLimit;
  pBVar29 = (ms->window).base;
  uVar22 = (ms->cParams).targetLength;
  local_e0 = 0xfff;
  if (uVar22 < 0xfff) {
    local_e0 = uVar22;
  }
  local_118 = &ms->opt;
  nextToUpdate3 = ms->nextToUpdate;
  local_110 = (ms->opt).matchTable;
  pZVar3 = (ms->opt).priceTable;
  local_c0 = 0;
  local_f0 = (BYTE *)((long)src + srcSize);
  local_b8 = 0;
  local_a8 = (code *)(&PTR_ZSTD_btGetAllMatches_noDict_3_00282ad0)[(ulong)dictMode * 4 + uVar20];
  uVar20 = (ulong)((uVar24 - 3 != 0) + 3);
  prVar4 = ms->ldmSeqStore;
  if (prVar4 == (rawSeqStore_t *)0x0) {
    local_68.seqStore.posInSequence = 0;
    local_68.seqStore.size = 0;
    local_68.seqStore.seq = (rawSeq *)0x0;
    local_68.seqStore.pos = 0;
    local_68.seqStore.capacity = 0;
  }
  else {
    local_68.seqStore.capacity = prVar4->capacity;
    local_68.seqStore.seq = prVar4->seq;
    local_68.seqStore.pos = prVar4->pos;
    local_68.seqStore.posInSequence = prVar4->posInSequence;
    local_68.seqStore.size = prVar4->size;
  }
  local_68.offset = 0;
  local_a0 = (BYTE *)((long)src + (srcSize - 8));
  local_68.startPosInBlock = 0;
  local_68.endPosInBlock = 0;
  local_100 = ms;
  local_d8 = (U32 (*) [3])rep;
  local_d0 = src;
  ZSTD_opt_getNextMatchAndUpdateSeqStore(&local_68,0,(U32)srcSize);
  ZSTD_rescaleFreqs(local_118,(BYTE *)src,srcSize,2);
  local_150 = (BYTE *)((ulong)(pBVar29 + uVar12 == (BYTE *)src) + (long)src);
  local_80 = local_f0 + -0x20;
  local_90 = pZVar3 + 1;
  local_e4 = 0;
  local_120 = (BYTE *)src;
  local_98 = uVar20;
  do {
    while( true ) {
      pBVar29 = local_f0;
      pZVar10 = local_110;
      if (local_a0 <= local_150) {
        return (long)local_f0 - (long)local_120;
      }
      iVar31 = (int)local_150;
      UVar28 = iVar31 - (int)local_120;
      nbMatches = (*local_a8)(local_110,local_100,&nextToUpdate3,local_150,local_f0,local_d8,
                              UVar28 == 0,uVar20);
      ZSTD_optLdm_processMatchCandidate
                (&local_68,pZVar10,&nbMatches,iVar31 - (int)local_d0,(int)pBVar29 - iVar31);
      pBVar29 = local_120;
      if ((BYTE *)(ulong)nbMatches != (BYTE *)0x0) break;
      local_150 = local_150 + 1;
    }
    for (lVar18 = 4; lVar18 != 7; lVar18 = lVar18 + 1) {
      pZVar3->rep[lVar18 + -4] = local_d8[-2][lVar18 + 2];
    }
    pZVar3->mlen = 0;
    pZVar3->litlen = UVar28;
    local_108 = (BYTE *)(ulong)nbMatches;
    local_88 = seqStore;
    UVar11 = ZSTD_litLengthPrice(UVar28,local_118,2);
    pZVar3->price = UVar11;
    uVar12 = (int)local_108 - 1;
    uVar24 = local_110[uVar12].len;
    local_b0 = uVar20;
    if (local_e0 < uVar24) {
      UVar11 = local_110[uVar12].off;
      uVar12 = 0;
    }
    else {
      if ((int)UVar11 < 0) {
        __assert_fail("opt[0].price >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x839b,
                      "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                     );
      }
      UVar13 = ZSTD_litLengthPrice(0,local_118,2);
      pZVar19 = local_90;
      for (uVar20 = 1; uVar20 < local_98; uVar20 = uVar20 + 1) {
        pZVar19->price = 0x40000000;
        pZVar19 = pZVar19 + 1;
      }
      pBVar29 = (BYTE *)0x0;
      while (pBVar29 != local_108) {
        uVar24 = local_110[(long)pBVar29].off;
        uVar12 = local_110[(long)pBVar29].len;
        uVar22 = 0x1f;
        if (uVar24 != 0) {
          for (; uVar24 >> uVar22 == 0; uVar22 = uVar22 - 1) {
          }
        }
        local_128 = CONCAT44(local_128._4_4_,uVar22 * 0x100 + 0x1000);
        local_f8 = pBVar29;
        while (uVar25 = (uint)uVar20, uVar25 <= uVar12) {
          if (uVar25 < 3) {
LAB_00168ef8:
            __assert_fail("matchLength >= MINMATCH",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x806c,
                          "U32 ZSTD_getMatchPrice(const U32, const U32, const optState_t *const, const int)"
                         );
          }
          uVar30 = uVar25 - 3;
          if ((local_100->opt).priceType == zop_predef) {
            UVar14 = ZSTD_fracWeight(uVar30);
            iVar31 = UVar14 + (int)local_128;
          }
          else {
            UVar14 = (local_100->opt).offCodeSumBasePrice;
            UVar15 = ZSTD_fracWeight((local_100->opt).offCodeFreq[uVar22]);
            if (uVar30 < 0x80) {
              uVar30 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar30];
            }
            else {
              uVar7 = 0x1f;
              if (uVar30 != 0) {
                for (; uVar30 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                }
              }
              uVar30 = (uVar7 ^ 0xffffffe0) + 0x44;
            }
            bVar2 = ""[uVar30];
            UVar17 = (local_100->opt).matchLengthSumBasePrice;
            UVar16 = ZSTD_fracWeight((local_100->opt).matchLengthFreq[uVar30]);
            iVar31 = (((bVar2 + uVar22) * 0x100 + (UVar14 - UVar15) + UVar17) - UVar16) + 0x33;
          }
          uVar20 = uVar20 & 0xffffffff;
          pZVar3[uVar20].mlen = uVar25;
          pZVar3[uVar20].off = uVar24;
          pZVar3[uVar20].litlen = UVar28;
          pZVar3[uVar20].price = iVar31 + UVar13 + UVar11;
          uVar20 = (ulong)(uVar25 + 1);
        }
        pBVar29 = local_f8 + 1;
      }
      uVar26 = (ulong)((int)uVar20 - 1);
      uVar20 = 1;
      while( true ) {
        optPtr = local_118;
        uVar21 = uVar26 & 0xffffffff;
        if (uVar21 < uVar20) break;
        if (uVar20 == 0x1000) {
          __assert_fail("cur < ZSTD_OPT_NUM",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x83b6,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        pZVar19 = pZVar3 + uVar20;
        UVar28 = 1;
        if (pZVar3[uVar20 - 1].mlen == 0) {
          UVar28 = pZVar19[-1].litlen + 1;
        }
        local_108 = local_150 + uVar20;
        iVar31 = pZVar19[-1].price;
        local_128 = uVar20;
        UVar11 = ZSTD_rawLiteralsCost(local_108 + -1,(U32)local_118,(optState_t *)0x2,(int)pZVar19);
        local_f8 = (BYTE *)CONCAT44(local_f8._4_4_,UVar11);
        UVar11 = ZSTD_litLengthPrice(UVar28,optPtr,2);
        iVar23 = UVar11 + (int)local_f8;
        UVar11 = ZSTD_litLengthPrice(UVar28 - 1,optPtr,2);
        iVar31 = (iVar23 + iVar31) - UVar11;
        if (999999999 < iVar31) {
          __assert_fail("price < 1000000000",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x83bf,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        if (pZVar3[uVar20].price < iVar31) {
          uVar24 = pZVar19->mlen;
          if (local_128 < uVar24) {
            __assert_fail("cur >= opt[cur].mlen",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x83d5,
                          "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                         );
          }
          if (uVar24 == 0) goto LAB_00168878;
          rVar34 = ZSTD_newRep(pZVar3[(int)local_128 - uVar24].rep,pZVar19->off,
                               (uint)(pZVar19->litlen == 0));
          *&pZVar19->rep = rVar34.rep;
        }
        else {
          pZVar19->off = 0;
          pZVar19->mlen = 0;
          pZVar19->litlen = UVar28;
          pZVar19->price = iVar31;
LAB_00168878:
          pZVar19->rep[2] = pZVar19[-1].rep[2];
          *(undefined8 *)pZVar19->rep = *(undefined8 *)pZVar19[-1].rep;
        }
        pZVar27 = local_100;
        uVar20 = local_128;
        if (local_108 <= local_a0) {
          if (local_128 == uVar21) break;
          iVar31 = pZVar19->price;
          if (iVar31 < 0) {
            __assert_fail("opt[cur].price >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x83e9,
                          "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                         );
          }
          UVar28 = 0;
          bVar33 = pZVar19->mlen != 0;
          if (!bVar33) {
            UVar28 = pZVar19->litlen;
          }
          local_c8 = &pZVar19->mlen;
          UVar11 = ZSTD_litLengthPrice(0,local_118,2);
          pBVar1 = local_f0;
          pBVar29 = local_108;
          pZVar10 = local_110;
          local_f8 = (BYTE *)CONCAT44(local_f8._4_4_,UVar11);
          nbMatches = (*local_a8)(local_110,pZVar27,&nextToUpdate3,local_108,local_f0,pZVar19->rep,
                                  bVar33,local_b0);
          ZSTD_optLdm_processMatchCandidate
                    (&local_68,pZVar10,&nbMatches,(int)pBVar29 - (int)local_d0,
                     (int)pBVar1 - (int)pBVar29);
          uVar20 = local_128;
          if ((ulong)nbMatches != 0) {
            uVar24 = pZVar10[nbMatches - 1].len;
            if ((local_e0 < uVar24) || (0xfff < uVar24 + (int)local_128)) {
              UVar13 = 0;
              if (*local_c8 == 0) {
                UVar13 = pZVar19->litlen;
              }
              UVar11 = local_110[nbMatches - 1].off;
              uVar12 = (int)local_128 - UVar13;
              pBVar29 = local_120;
              if (0x1000 < uVar12) {
                uVar12 = 0;
              }
              goto LAB_00168bd2;
            }
            local_f8 = (BYTE *)CONCAT44(local_f8._4_4_,(int)local_f8 + iVar31);
            uVar21 = 0;
            pZVar27 = local_100;
            local_78 = (ulong)nbMatches;
            while (uVar21 != local_78) {
              local_148 = local_98;
              if (uVar21 != 0) {
                local_148 = (ulong)(local_110[uVar21 - 1].len + 1);
              }
              uVar24 = local_110[uVar21].off;
              uVar32 = (ulong)local_110[uVar21].len;
              local_108 = (BYTE *)CONCAT44(local_108._4_4_,uVar24);
              uVar12 = 0x1f;
              if (uVar24 != 0) {
                for (; uVar24 >> uVar12 == 0; uVar12 = uVar12 - 1) {
                }
              }
              local_c8 = (U32 *)CONCAT44(local_c8._4_4_,uVar12 * 0x100 + 0x1000);
              local_70 = uVar21;
              for (; local_148 <= uVar32; uVar32 = uVar32 - 1) {
                if (uVar32 < 3) goto LAB_00168ef8;
                UVar11 = (U32)uVar32;
                uVar24 = UVar11 - 3;
                if ((pZVar27->opt).priceType == zop_predef) {
                  UVar13 = ZSTD_fracWeight(uVar24);
                  iVar31 = UVar13 + (int)local_c8;
                }
                else {
                  UVar13 = (pZVar27->opt).offCodeSumBasePrice;
                  UVar14 = ZSTD_fracWeight((pZVar27->opt).offCodeFreq[uVar12]);
                  pZVar27 = local_100;
                  if (uVar24 < 0x80) {
                    uVar24 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar24];
                  }
                  else {
                    uVar22 = 0x1f;
                    if (uVar24 != 0) {
                      for (; uVar24 >> uVar22 == 0; uVar22 = uVar22 - 1) {
                      }
                    }
                    uVar24 = (uVar22 ^ 0xffffffe0) + 0x44;
                  }
                  bVar2 = ""[uVar24];
                  UVar15 = (local_100->opt).matchLengthSumBasePrice;
                  UVar17 = ZSTD_fracWeight((local_100->opt).matchLengthFreq[uVar24]);
                  iVar31 = (((bVar2 + uVar12) * 0x100 + (UVar13 - UVar14) + UVar15) - UVar17) + 0x33
                  ;
                }
                uVar24 = UVar11 + (int)local_128;
                uVar20 = (ulong)uVar24;
                if (((uint)uVar26 < uVar24) || (iVar31 + (int)local_f8 < pZVar3[uVar20].price)) {
                  uVar26 = uVar26 & 0xffffffff;
                  pZVar19 = local_90 + uVar26;
                  for (; uVar26 < uVar20; uVar26 = uVar26 + 1) {
                    pZVar19->price = 0x40000000;
                    pZVar19 = pZVar19 + 1;
                  }
                  pZVar3[uVar20].mlen = UVar11;
                  pZVar3[uVar20].off = (U32)local_108;
                  pZVar3[uVar20].litlen = UVar28;
                  pZVar3[uVar20].price = iVar31 + (int)local_f8;
                }
                uVar20 = local_128;
              }
              uVar21 = local_70 + 1;
            }
          }
        }
        uVar20 = uVar20 + 1;
      }
      local_e4 = pZVar3[uVar21].price;
      UVar11 = pZVar3[uVar21].off;
      uVar24 = pZVar3[uVar21].mlen;
      UVar28 = pZVar3[uVar21].litlen;
      local_b8 = pZVar3[uVar21].rep[2];
      local_c0 = *(undefined8 *)pZVar3[uVar21].rep;
      uVar12 = (uint)uVar26 - (UVar28 + uVar24);
      pBVar29 = local_120;
      if ((uint)uVar26 < UVar28 + uVar24 || uVar12 == 0) {
        uVar12 = 0;
      }
      else if (0xfff < uVar12) {
        __assert_fail("cur < ZSTD_OPT_NUM",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8428,
                      "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                     );
      }
    }
LAB_00168bd2:
    if (pZVar3->mlen != 0) {
      __assert_fail("opt[0].mlen == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x842b,
                    "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                   );
    }
    if (uVar24 == 0) {
      (*local_d8)[2] = pZVar3[uVar12].rep[2];
      *(undefined8 *)*local_d8 = *(undefined8 *)pZVar3[uVar12].rep;
    }
    else {
      rVar34 = ZSTD_newRep(pZVar3[uVar12].rep,UVar11,(uint)(UVar28 == 0));
      *local_d8 = rVar34.rep;
    }
    seqStore = local_88;
    if (0xfff < uVar12 + 1) {
      __assert_fail("storeEnd < ZSTD_OPT_NUM",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x843e,
                    "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                   );
    }
    uVar26 = (ulong)(uVar12 + 1);
    pZVar3[uVar26].price = local_e4;
    pZVar3[uVar26].off = UVar11;
    pZVar3[uVar26].mlen = uVar24;
    pZVar3[uVar26].litlen = UVar28;
    *(undefined8 *)pZVar3[uVar26].rep = local_c0;
    pZVar3[uVar26].rep[2] = local_b8;
    uVar20 = (ulong)uVar12;
    while (uVar24 = (uint)uVar20, uVar24 != 0) {
      uVar22 = pZVar3[uVar20].litlen + pZVar3[uVar20].mlen;
      pZVar19 = pZVar3 + uVar20;
      iVar31 = pZVar19->price;
      UVar11 = pZVar19->off;
      UVar13 = pZVar19->mlen;
      UVar14 = pZVar19->litlen;
      pZVar19 = pZVar3 + uVar20;
      UVar28 = pZVar19->rep[0];
      uVar8 = *(undefined8 *)(&pZVar19->litlen + 2);
      pZVar9 = pZVar3 + uVar12;
      pZVar9->litlen = pZVar19->litlen;
      pZVar9->rep[0] = UVar28;
      *(undefined8 *)(&pZVar9->litlen + 2) = uVar8;
      pZVar19 = pZVar3 + uVar12;
      pZVar19->price = iVar31;
      pZVar19->off = UVar11;
      pZVar19->mlen = UVar13;
      pZVar19->litlen = UVar14;
      uVar20 = (ulong)(uVar24 - uVar22);
      if (uVar24 < uVar22) {
        uVar20 = 0;
      }
      uVar12 = uVar12 - 1;
    }
    for (uVar20 = (ulong)(uVar12 + 1); uVar20 <= uVar26; uVar20 = uVar20 + 1) {
      uVar24 = pZVar3[uVar20].litlen;
      uVar21 = (ulong)uVar24;
      uVar12 = pZVar3[uVar20].mlen;
      if ((ulong)uVar12 == 0) {
        if (uVar20 != uVar26) {
          __assert_fail("storePos == storeEnd",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x8457,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        local_150 = pBVar29 + uVar21;
      }
      else {
        pBVar1 = pBVar29 + uVar21;
        if (local_f0 < pBVar1) {
          __assert_fail("anchor + llen <= iend",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x845c,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        UVar28 = pZVar3[uVar20].off;
        ZSTD_updateStats(local_118,uVar24,pBVar29,UVar28,uVar12);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        pBVar5 = seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < pBVar5 + uVar21) {
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_80 < pBVar1) {
          ZSTD_safecopyLiterals(pBVar5,pBVar29,pBVar1,local_80);
LAB_00168d70:
          seqStore->lit = seqStore->lit + uVar21;
          if (0xffff < uVar24) {
            if (seqStore->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46a0,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar8 = *(undefined8 *)(pBVar29 + 8);
          *(undefined8 *)pBVar5 = *(undefined8 *)pBVar29;
          *(undefined8 *)(pBVar5 + 8) = uVar8;
          if (0x10 < uVar24) {
            pBVar1 = seqStore->lit;
            if ((BYTE *)0xffffffffffffffe0 < pBVar1 + 0x10 + (-0x10 - (long)(pBVar29 + 0x10))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar8 = *(undefined8 *)(pBVar29 + 0x18);
            *(undefined8 *)(pBVar1 + 0x10) = *(undefined8 *)(pBVar29 + 0x10);
            *(undefined8 *)(pBVar1 + 0x18) = uVar8;
            if (0x10 < uVar21 - 0x10) {
              lVar18 = 0;
              do {
                uVar8 = *(undefined8 *)(pBVar29 + lVar18 + 0x20 + 8);
                pBVar5 = pBVar1 + lVar18 + 0x20;
                *(undefined8 *)pBVar5 = *(undefined8 *)(pBVar29 + lVar18 + 0x20);
                *(undefined8 *)(pBVar5 + 8) = uVar8;
                uVar8 = *(undefined8 *)(pBVar29 + lVar18 + 0x30 + 8);
                *(undefined8 *)(pBVar5 + 0x10) = *(undefined8 *)(pBVar29 + lVar18 + 0x30);
                *(undefined8 *)(pBVar5 + 0x18) = uVar8;
                lVar18 = lVar18 + 0x20;
              } while (pBVar5 + 0x20 < pBVar1 + uVar21);
              goto LAB_00168d70;
            }
          }
          seqStore->lit = seqStore->lit + uVar21;
        }
        psVar6 = seqStore->sequences;
        psVar6->litLength = (U16)uVar24;
        psVar6->offBase = UVar28;
        if (uVar12 < 3) {
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar21 = (ulong)uVar12 - 3;
        if (0xffff < uVar21) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar6 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar6->mlBase = (U16)uVar21;
        seqStore->sequences = psVar6 + 1;
        pBVar29 = pBVar29 + (uVar12 + uVar24);
        local_150 = pBVar29;
      }
    }
    local_120 = pBVar29;
    ZSTD_setBasePrices(local_118,2);
    uVar20 = local_b0;
  } while( true );
}

Assistant:

static size_t ZSTD_compressBlock_opt2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        const void* src, size_t srcSize, const ZSTD_dictMode_e dictMode)
{
    return ZSTD_compressBlock_opt_generic(ms, seqStore, rep, src, srcSize, 2 /* optLevel */, dictMode);
}